

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::EvaluateSectionPoint
          (ChElementBeamANCF_3333 *this,double xi,ChVector<double> *point)

{
  VectorN Sxi_compact;
  Matrix3xN e_bar;
  Matrix3xN *local_150;
  VectorN *local_148;
  VectorN local_140;
  Matrix3xN local_f8;
  
  Calc_Sxi_compact(this,&local_140,xi,0.0,0.0);
  CalcCoordMatrix(this,&local_f8);
  local_150 = &local_f8;
  local_148 = &local_140;
  ChVector<double>::operator=
            (point,(MatrixBase<Eigen::Product<Eigen::Matrix<double,_3,_9,_1,_3,_9>,_Eigen::Matrix<double,_9,_1,_0,_9,_1>,_0>_>
                    *)&local_150);
  return;
}

Assistant:

void ChElementBeamANCF_3333::EvaluateSectionPoint(const double xi, ChVector<>& point) {
    VectorN Sxi_compact;
    Calc_Sxi_compact(Sxi_compact, xi, 0, 0);

    Matrix3xN e_bar;
    CalcCoordMatrix(e_bar);

    // r = S*e written in compact form
    point = e_bar * Sxi_compact;
}